

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O1

void DES_ecb_encrypt_ex(uint8_t *in,uint8_t *out,DES_key_schedule *schedule,int is_encrypt)

{
  uint32_t ll [2];
  uint local_18;
  undefined4 local_14;
  
  local_18 = *(uint *)in;
  local_14 = *(undefined4 *)(in + 4);
  DES_encrypt1(&local_18,(DES_key_schedule *)schedule,is_encrypt);
  *(uint *)out = local_18;
  *(undefined4 *)(out + 4) = local_14;
  return;
}

Assistant:

void DES_ecb_encrypt_ex(const uint8_t in[8], uint8_t out[8],
                        const DES_key_schedule *schedule, int is_encrypt) {
  uint32_t ll[2];
  ll[0] = CRYPTO_load_u32_le(in);
  ll[1] = CRYPTO_load_u32_le(in + 4);
  DES_encrypt1(ll, schedule, is_encrypt);
  CRYPTO_store_u32_le(out, ll[0]);
  CRYPTO_store_u32_le(out + 4, ll[1]);
}